

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O2

Vector<float,_4> __thiscall
deqp::gles2::Functional::(anonymous_namespace)::convertToTypeVec<float,4,float,2>
          (_anonymous_namespace_ *this,Vector<float,_2> *v)

{
  int ndx;
  long lVar1;
  ulong extraout_XMM0_Qa;
  ulong uVar2;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar3;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(undefined4 *)(this + lVar1 * 4) = 0;
  }
  *(undefined4 *)(this + 0xc) = 0x3f800000;
  uVar2 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    uVar2 = (ulong)(uint)v->m_data[lVar1];
    *(float *)(this + lVar1 * 4) = v->m_data[lVar1];
  }
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar3.m_data[0] = (float)(int)uVar2;
  VVar3.m_data[1] = (float)(int)(uVar2 >> 0x20);
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

tcu::Vector<T1, S1> convertToTypeVec (const tcu::Vector<T2, S2>& v)
{
	tcu::Vector<T1, S1> retVal;

	for (int ndx = 0; ndx < S1; ++ndx)
		retVal[ndx] = T1(0);

	if (S1 == 4)
		retVal[3] = T1(1);

	for (int ndx = 0; ndx < de::min(S1, S2); ++ndx)
		retVal[ndx] = T1(v[ndx]);

	return retVal;
}